

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

CURLcode cw_out_do_write(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,_Bool flush_all,char *buf
                        ,size_t blen)

{
  cw_out_buf **pcwbuf;
  bool bVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  size_t *in_RAX;
  undefined7 in_register_00000009;
  size_t consumed;
  
  pcwbuf = &ctx->buf;
  if (((ctx->buf == (cw_out_buf *)0x0) || (ctx->buf->type == otype)) ||
     (CVar2 = cw_out_flush_chain(ctx,data,pcwbuf,flush_all), CVar2 == CURLE_OK)) {
    if (*pcwbuf == (cw_out_buf *)0x0) {
      CVar3 = cw_out_ptr_flush(ctx,data,otype,flush_all,buf,(size_t)&stack0xffffffffffffffc8,in_RAX)
      ;
      bVar1 = true;
      CVar2 = CVar3;
      if (CVar3 == CURLE_OK) {
        if ((buf < in_RAX || (long)buf - (long)in_RAX == 0) ||
           (CVar2 = cw_out_append(ctx,otype,
                                  (char *)CONCAT71(in_register_00000009,flush_all) + (long)in_RAX,
                                  (long)buf - (long)in_RAX), CVar2 == CURLE_OK)) {
          CVar2 = CURLE_OK;
          bVar1 = false;
        }
        else {
          bVar1 = false;
        }
      }
      if (bVar1) {
        return CVar3;
      }
    }
    else {
      CVar2 = cw_out_append(ctx,otype,(char *)CONCAT71(in_register_00000009,flush_all),(size_t)buf);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      CVar2 = cw_out_flush_chain(ctx,data,pcwbuf,SUB81(buf,0));
    }
  }
  if (CVar2 != CURLE_OK) {
    ctx->field_0x28 = ctx->field_0x28 | 2;
    cw_out_bufs_free(ctx);
  }
  return CVar2;
}

Assistant:

static CURLcode cw_out_do_write(struct cw_out_ctx *ctx,
                                struct Curl_easy *data,
                                cw_out_type otype,
                                bool flush_all,
                                const char *buf, size_t blen)
{
  CURLcode result = CURLE_OK;

  /* if we have buffered data and it is a different type than what
   * we are writing now, try to flush all */
  if(ctx->buf && ctx->buf->type != otype) {
    result = cw_out_flush_chain(ctx, data, &ctx->buf, TRUE);
    if(result)
      goto out;
  }

  if(ctx->buf) {
    /* still have buffered data, append and flush */
    result = cw_out_append(ctx, otype, buf, blen);
    if(result)
      return result;
    result = cw_out_flush_chain(ctx, data, &ctx->buf, flush_all);
    if(result)
      goto out;
  }
  else {
    /* nothing buffered, try direct write */
    size_t consumed;
    result = cw_out_ptr_flush(ctx, data, otype, flush_all,
                              buf, blen, &consumed);
    if(result)
      return result;
    if(consumed < blen) {
      /* did not write all, append the rest */
      result = cw_out_append(ctx, otype, buf + consumed, blen - consumed);
      if(result)
        goto out;
    }
  }

out:
  if(result) {
    /* We do not want to invoked client callbacks a second time after
     * encountering an error. See issue #13337 */
    ctx->errored = TRUE;
    cw_out_bufs_free(ctx);
  }
  return result;
}